

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_envs.cxx
# Opt level: O2

void __thiscall xray_re::xr_sound_env_object::save_v12(xr_sound_env_object *this,xr_ini_writer *w)

{
  size_t __n;
  string asStack_58 [32];
  string local_38 [32];
  
  xr_custom_object::save_v12((xr_custom_object *)this,w);
  std::__cxx11::string::string(local_38,(string *)&this->m_inner);
  xr_ini_writer::write(w,0x1d2781,local_38,0);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::string(asStack_58,(string *)&this->m_outer);
  __n = 0;
  xr_ini_writer::write(w,0x1d278b,asStack_58,0);
  std::__cxx11::string::~string(asStack_58);
  xr_ini_writer::write(w,0x1d3f45,(void *)0x12,__n);
  return;
}

Assistant:

void xr_sound_env_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("env_inner", m_inner, false);
	w->write("env_outer", m_outer, false);

	w->write("version", SOUNDENV_VERSION);
}